

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_torrent.cpp
# Opt level: O2

void libtorrent::anon_unknown_21::update_atp
               (shared_ptr<libtorrent::torrent_info> *ti,add_torrent_params *atp)

{
  byte *pbVar1;
  element_type *peVar2;
  digest32<256L> *pdVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  sha256_hash pad_00;
  bool bVar9;
  int iVar10;
  int iVar11;
  int num_leafs;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar12;
  int64_t iVar13;
  announce_entry *ae;
  pointer __x;
  pointer __x_00;
  int i;
  long lVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  file_index_t index;
  long lVar15;
  vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *this_00;
  bitfield *this_01;
  span<const_libtorrent::digest32<256L>_> leaves;
  span<const_char> sVar16;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> scratch;
  sha256_hash pad;
  internal_drained_state drained_state;
  sha256_hash computed_root;
  sha256_hash local_50;
  
  torrent_info::_internal_drain
            ((ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  for (__x = drained_state.urls.
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             .
             super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __x != drained_state.urls.
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             .
             super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&atp->trackers,&__x->url);
    pad.m_number._M_elems[0] = (uint)__x->tier;
    ::std::vector<int,_std::allocator<int>_>::emplace_back<int>(&atp->tracker_tiers,(int *)&pad);
  }
  if (((((ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_flags).m_val & 4) != 0) {
    pbVar1 = (byte *)((long)&(atp->flags).m_val + 3);
    *pbVar1 = *pbVar1 | 1;
  }
  for (__x_00 = drained_state.web_seeds.
                super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __x_00 != drained_state.web_seeds.
                super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish; __x_00 = __x_00 + 1) {
    this = &atp->http_seeds;
    if ((__x_00->type == '\x01') || (this = &atp->url_seeds, __x_00->type == '\0')) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this,&__x_00->url);
    }
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::_M_move_assign(&atp->dht_nodes,&drained_state.nodes);
  peVar2 = (ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((peVar2->m_flags).m_val & 0x10) != 0) {
    iVar10 = file_storage::blocks_per_piece(&peVar2->m_files);
    scratch.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scratch.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scratch.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    merkle_pad(&pad,iVar10,1);
    peVar2 = (ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar10 = file_storage::num_files(&peVar2->m_files);
    aux::
    container_wrapper<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>>
    ::resize<int,void>((container_wrapper<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>>
                        *)&atp->merkle_trees,iVar10);
    iVar10 = file_storage::num_files(&peVar2->m_files);
    aux::
    container_wrapper<libtorrent::bitfield,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>>
    ::resize<int,void>((container_wrapper<libtorrent::bitfield,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>>
                        *)&atp->merkle_tree_mask,iVar10);
    iVar12 = file_storage::file_range(&peVar2->m_files);
    for (lVar15 = (long)iVar12._begin.m_val.m_val; lVar15 != (long)iVar12 >> 0x20;
        lVar15 = lVar15 + 1) {
      index.m_val = (int)lVar15;
      bVar9 = file_storage::pad_file_at(&peVar2->m_files,index);
      if (!bVar9) {
        iVar13 = file_storage::file_size(&peVar2->m_files,index);
        if (iVar13 != 0) {
          sVar16 = torrent_info::piece_layer
                             ((ti->
                              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr,index);
          this_00 = (vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *
                    )((atp->merkle_trees).
                      super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                      .
                      super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar15);
          ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
          reserve((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   *)this_00,sVar16.m_len / 0x20);
          for (lVar14 = 0; lVar14 < sVar16.m_len; lVar14 = lVar14 + 0x20) {
            computed_root.m_number._M_elems._0_8_ = sVar16.m_ptr + lVar14;
            ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
            emplace_back<char_const*>(this_00,(char **)&computed_root);
          }
          iVar10 = file_storage::file_num_blocks(&peVar2->m_files,index);
          iVar10 = merkle_num_leafs(iVar10);
          iVar10 = merkle_num_nodes(iVar10);
          iVar11 = file_storage::file_num_pieces(&peVar2->m_files,index);
          num_leafs = merkle_num_leafs(iVar11);
          pdVar3 = *(digest32<256L> **)this_00;
          if (pdVar3 != *(digest32<256L> **)(this_00 + 8)) {
            leaves.m_len = (long)*(digest32<256L> **)(this_00 + 8) - (long)pdVar3 >> 5;
            pad_00.m_number._M_elems[1] = pad.m_number._M_elems[1];
            pad_00.m_number._M_elems[0] = pad.m_number._M_elems[0];
            pad_00.m_number._M_elems[2] = pad.m_number._M_elems[2];
            pad_00.m_number._M_elems[3] = pad.m_number._M_elems[3];
            pad_00.m_number._M_elems[4] = pad.m_number._M_elems[4];
            pad_00.m_number._M_elems[5] = pad.m_number._M_elems[5];
            pad_00.m_number._M_elems[6] = pad.m_number._M_elems[6];
            pad_00.m_number._M_elems[7] = pad.m_number._M_elems[7];
            leaves.m_ptr = pdVar3;
            merkle_root_scratch(&computed_root,leaves,num_leafs,pad_00,&scratch);
            file_storage::root(&local_50,&peVar2->m_files,index);
            bVar9 = digest32<256L>::operator!=(&computed_root,&local_50);
            if (bVar9) {
              local_50.m_number._M_elems[0] = 0xd7;
              aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                        ((error_code_enum *)&local_50);
            }
          }
          this_01 = (atp->merkle_tree_mask).
                    super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                    super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar15;
          bitfield::resize(this_01,iVar10,false);
          iVar10 = merkle_first_leaf(num_leafs);
          iVar11 = iVar11 + iVar10;
          for (; iVar10 < iVar11; iVar10 = iVar10 + 1) {
            bitfield::set_bit(this_01,iVar10);
          }
        }
      }
    }
    torrent_info::free_piece_layers
              ((ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              );
    ::std::_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
    ~_Vector_base(&scratch.
                   super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 );
  }
  ::std::__cxx11::string::_M_assign((string *)&atp->comment);
  ::std::__cxx11::string::_M_assign((string *)&atp->created_by);
  peVar2 = (ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  atp->creation_date = peVar2->m_creation_date;
  uVar4 = *(undefined8 *)((peVar2->m_info_hash).v1.m_number._M_elems + 2);
  uVar5 = *(undefined8 *)((peVar2->m_info_hash).v1.m_number._M_elems + 4);
  uVar6 = *(undefined8 *)((peVar2->m_info_hash).v2.m_number._M_elems + 1);
  uVar7 = *(undefined8 *)((peVar2->m_info_hash).v2.m_number._M_elems + 3);
  uVar8 = *(undefined8 *)((peVar2->m_info_hash).v2.m_number._M_elems + 5);
  *(undefined8 *)(atp->info_hashes).v1.m_number._M_elems =
       *(undefined8 *)(peVar2->m_info_hash).v1.m_number._M_elems;
  *(undefined8 *)((atp->info_hashes).v1.m_number._M_elems + 2) = uVar4;
  *(undefined8 *)((atp->info_hashes).v1.m_number._M_elems + 4) = uVar5;
  *(undefined8 *)((atp->info_hashes).v2.m_number._M_elems + 1) = uVar6;
  *(undefined8 *)((atp->info_hashes).v2.m_number._M_elems + 3) = uVar7;
  *(undefined8 *)((atp->info_hashes).v2.m_number._M_elems + 5) = uVar8;
  (atp->info_hashes).v2.m_number._M_elems[7] = (peVar2->m_info_hash).v2.m_number._M_elems[7];
  ::std::__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>,
             &ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>);
  aux::internal_drained_state::~internal_drained_state(&drained_state);
  return;
}

Assistant:

void update_atp(std::shared_ptr<torrent_info> ti, add_torrent_params& atp)
	{
		// This is a temporary measure until all non info-dict content is parsed
		// here, rather than the torrent_info constructor
		auto drained_state = ti->_internal_drain();
		for (auto const& ae : drained_state.urls)
		{
			atp.trackers.push_back(std::move(ae.url));
			atp.tracker_tiers.push_back(ae.tier);
		}

		if (ti->is_i2p())
			atp.flags |= torrent_flags::i2p_torrent;

		for (auto const& ws : drained_state.web_seeds)
		{
#if TORRENT_ABI_VERSION < 4
			if (ws.type == web_seed_entry::url_seed)
#endif
				atp.url_seeds.push_back(std::move(ws.url));
#if TORRENT_ABI_VERSION < 4
			else if (ws.type == web_seed_entry::http_seed)
				atp.http_seeds.push_back(std::move(ws.url));
#endif
		}

		atp.dht_nodes = std::move(drained_state.nodes);

		if (ti->v2_piece_hashes_verified())
		{
			int const blocks_per_piece = ti->files().blocks_per_piece();
			std::vector<sha256_hash> scratch;
			sha256_hash const pad = merkle_pad(blocks_per_piece, 1);
			file_storage const& fs = ti->files();
			atp.merkle_trees.resize(fs.num_files());
			atp.merkle_tree_mask.resize(fs.num_files());
			for (auto const f : fs.file_range())
			{
				if (fs.pad_file_at(f)) continue;
				if (fs.file_size(f) == 0) continue;
				auto const bytes = ti->piece_layer(f);
				auto& layer = atp.merkle_trees[f];
				layer.reserve(std::size_t(bytes.size() / sha256_hash::size()));
				for (int i = 0; i < bytes.size(); i += int(sha256_hash::size()))
					layer.emplace_back(bytes.data() + i);

				int const full_size = merkle_num_nodes(
					merkle_num_leafs(fs.file_num_blocks(f)));
				int const num_pieces = fs.file_num_pieces(f);
				int const piece_layer_size = merkle_num_leafs(num_pieces);

				if (!layer.empty())
				{
					sha256_hash const computed_root = merkle_root_scratch(layer
						, piece_layer_size
						, pad
						, scratch);
					if (computed_root != fs.root(f))
						aux::throw_ex<system_error>(errors::torrent_invalid_piece_layer);
				}

				auto& mask = atp.merkle_tree_mask[f];
				mask.resize(full_size, false);
				for (int i = merkle_first_leaf(piece_layer_size)
					, end = i + num_pieces; i < end; ++i)
				{
					mask.set_bit(i);
				}
			}
			ti->free_piece_layers();
		}

		atp.comment = ti->comment();
		atp.created_by = ti->creator();
		atp.creation_date = ti->creation_date();
		atp.info_hashes = ti->info_hashes();
		atp.ti = std::move(ti);
	}
}